

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilisticSampler.h
# Opt level: O2

void __thiscall
jaegertracing::samplers::ProbabilisticSampler::ProbabilisticSampler
          (ProbabilisticSampler *this,double samplingRate)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  initializer_list<jaegertracing::Tag> __l;
  allocator_type local_10b;
  allocator local_10a;
  allocator local_109;
  double local_108;
  ulong local_100;
  string local_f8;
  string local_d8;
  Tag local_b8 [2];
  
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_00297b80;
  local_108 = 1.0;
  if (samplingRate <= 1.0) {
    local_108 = samplingRate;
  }
  if (local_108 <= 0.0) {
    local_108 = 0.0;
  }
  this->_samplingRate = local_108;
  lVar4 = _DAT_0024d870 * (longdouble)local_108;
  lVar5 = (longdouble)9.223372e+18;
  lVar6 = (longdouble)0;
  if (lVar5 <= lVar4) {
    lVar6 = lVar5;
  }
  local_100 = (ulong)ROUND(lVar4 - lVar6);
  uVar1 = (ulong)(lVar5 <= lVar4) << 0x3f ^ local_100;
  uVar2 = 0xffffffffffffffff;
  if (lVar4 != _DAT_0024d870) {
    uVar2 = uVar1;
  }
  if (NAN(lVar4) || NAN(_DAT_0024d870)) {
    uVar2 = uVar1;
  }
  this->_samplingBoundary = uVar2;
  std::__cxx11::string::string((string *)&local_d8,"sampler.type",&local_109);
  Tag::Tag<char_const*const&>(local_b8,&local_d8,&kSamplerTypeProbabilistic);
  std::__cxx11::string::string((string *)&local_f8,"sampler.param",&local_10a);
  Tag::Tag<double&>(local_b8 + 1,&local_f8,&this->_samplingRate);
  __l._M_len = 2;
  __l._M_array = local_b8;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,&local_10b);
  lVar3 = 0x48;
  do {
    Tag::~Tag((Tag *)((long)&local_b8[0]._key._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != -0x48);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

explicit ProbabilisticSampler(double samplingRate)
        : _samplingRate(std::max(0.0, std::min(samplingRate, 1.0)))
        , _samplingBoundary(computeSamplingBoundary(_samplingRate))
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeProbabilistic },
                  { kSamplerParamTagKey, _samplingRate } })
    {
    }